

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

ecs_iter_t *
ecs_scope_iter_w_filter
          (ecs_iter_t *__return_storage_ptr__,ecs_world_t *world,ecs_entity_t parent,
          ecs_filter_t *filter)

{
  ecs_type_t peVar1;
  ecs_match_kind_t eVar2;
  int32_t iVar3;
  ecs_vector_t *vector;
  uint uStack_4c;
  
  eVar2 = filter->exclude_kind;
  *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x10) = filter->include_kind;
  *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x14) = eVar2;
  peVar1 = filter->exclude;
  (__return_storage_ptr__->iter).parent.filter.include = filter->include;
  (__return_storage_ptr__->iter).parent.filter.exclude = peVar1;
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,parent);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->real_world = (ecs_world_t *)0x0;
  __return_storage_ptr__->system = 0;
  __return_storage_ptr__->kind = EcsQuerySimpleIter;
  __return_storage_ptr__->table = (ecs_iter_table_t *)0x0;
  __return_storage_ptr__->query = (ecs_query_t *)0x0;
  iVar3 = ecs_vector_count(vector);
  __return_storage_ptr__->table_count = iVar3;
  __return_storage_ptr__->inactive_table_count = 0;
  __return_storage_ptr__->column_count = 0;
  __return_storage_ptr__->table_columns = (void *)0x0;
  __return_storage_ptr__->entities = (ecs_entity_t *)0x0;
  __return_storage_ptr__->total_count = 0;
  __return_storage_ptr__->param = (void *)0x0;
  __return_storage_ptr__->delta_time = 0.0;
  __return_storage_ptr__->delta_system_time = 0.0;
  __return_storage_ptr__->world_time = 0.0;
  __return_storage_ptr__->frame_offset = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->triggered_by = (ecs_entities_t *)0x0;
  __return_storage_ptr__->interrupted_by = 0;
  (__return_storage_ptr__->iter).parent.tables = vector;
  (__return_storage_ptr__->iter).parent.index = 0;
  *(ulong *)((long)&__return_storage_ptr__->iter + 0x24) = (ulong)uStack_4c;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.columns + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.table + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.data + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.components + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.types + 4) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->iter + 0x54) = 0;
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_scope_iter_w_filter(
    ecs_world_t *world,
    ecs_entity_t parent,
    ecs_filter_t *filter)
{
    ecs_scope_iter_t iter = {
        .filter = *filter,
        .tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, parent),
        .index = 0
    };

    return (ecs_iter_t) {
        .world = world,
        .iter.parent = iter,
        .table_count = ecs_vector_count(iter.tables)
    };
}